

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_Complementarity_Test::TestBody(ProblemTest_Complementarity_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_3b0;
  AssertionResult gtest_ar_;
  string gtest_expected_message;
  AssertHelper local_378;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       p.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start ==
       p.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_expected_message,(internal *)&gtest_ar_,
               (AssertionResult *)"p.HasComplementarity()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x23d,gtest_expected_message._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    std::__cxx11::string::~string((string *)&gtest_expected_message);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&p,0.0,1.0,CONTINUOUS);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&p,0.0,1.0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity(&p,0,0,(ComplInfo)0x0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       p.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       p.compl_vars_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_expected_message,(internal *)&gtest_ar_,
               (AssertionResult *)"p.HasComplementarity()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x242,gtest_expected_message._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    std::__cxx11::string::~string((string *)&gtest_expected_message);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::AssertionSuccess();
  if (gtest_ar_.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_3b0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity(&p,-1,0,(ComplInfo)0x0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_,
               (char (*) [127])
               "Expected: p.SetComplementarity(-1, 0, ComplInfo(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar_.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x243,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::AssertionSuccess();
  if (gtest_ar_.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_3b0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity(&p,1,0,(ComplInfo)0x0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_,
               (char (*) [126])
               "Expected: p.SetComplementarity(1, 0, ComplInfo(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar_.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x244,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::AssertionSuccess();
  if (gtest_ar_.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_3b0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity(&p,0,-1,(ComplInfo)0x0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_,
               (char (*) [127])
               "Expected: p.SetComplementarity(0, -1, ComplInfo(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar_.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x245,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::AssertionSuccess();
  if (gtest_ar_.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_3b0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity(&p,0,1,(ComplInfo)0x0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_,
               (char (*) [126])
               "Expected: p.SetComplementarity(0, 1, ComplInfo(0)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar_.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x246,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, Complementarity) {
  Problem p;
  EXPECT_FALSE(p.HasComplementarity());
  p.AddVar(0, 1);
  p.AddCon(0, 1);
  using mp::ComplInfo;
  p.SetComplementarity(0, 0, ComplInfo(0));
  EXPECT_TRUE(p.HasComplementarity());
  EXPECT_ASSERT(p.SetComplementarity(-1, 0, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(1, 0, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(0, -1, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(0, 1, ComplInfo(0)), "invalid index");
}